

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::AnimatedPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,AnimatedPrimitive *this,Ray *r,
          Float tMax)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  Interval<float> IVar9;
  Interval<float> IVar10;
  Interval<float> i;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  int vb;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  optional<pbrt::ShapeIntersection> si;
  type va;
  undefined1 auStack_1cc [12];
  Interval<float> IStack_1c8;
  Interval<float> IStack_1c0;
  Float FStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Tuple3<pbrt::Normal3,_float> aTStack_1a8 [2];
  MediumInterface *local_190;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_188;
  Tuple3<pbrt::Vector3,_float> local_180 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_168 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_150 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_138 [2];
  Tuple3<pbrt::Normal3,_float> TStack_120;
  int iStack_114;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_110;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_108;
  Tuple3<pbrt::Vector3,_float> local_100 [3];
  Float FStack_dc;
  Ray local_d8;
  Transform interpRenderFromPrimitive;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  AnimatedTransform::Interpolate(&interpRenderFromPrimitive,&this->renderFromPrimitive,r->time);
  fVar19 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar11._4_4_ = fVar19;
  auVar11._0_4_ = fVar19;
  auVar11._8_4_ = fVar19;
  auVar11._12_4_ = fVar19;
  fVar19 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar8._4_4_ = fVar19;
  auVar8._0_4_ = fVar19;
  auVar8._8_4_ = fVar19;
  auVar8._12_4_ = fVar19;
  _va = vmovlhps_avx(auVar11,auVar8);
  fVar19 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar16._4_4_ = fVar19;
  auVar16._0_4_ = fVar19;
  auVar16._8_4_ = fVar19;
  auVar16._12_4_ = fVar19;
  IStack_1c0 = (Interval<float>)vmovlps_avx(auVar16);
  Transform::ApplyInverse((Point3fi *)&si,&interpRenderFromPrimitive,(Point3fi *)&va);
  fVar19 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar15 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * interpRenderFromPrimitive.mInv.m[0][1])),
                            ZEXT416((uint)fVar19),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[0][0]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar15),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[0][2]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * interpRenderFromPrimitive.mInv.m[1][1])),
                           ZEXT416((uint)fVar19),
                           ZEXT416((uint)interpRenderFromPrimitive.mInv.m[1][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar15),
                           ZEXT416((uint)interpRenderFromPrimitive.mInv.m[1][2]));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * interpRenderFromPrimitive.mInv.m[2][1])),
                            ZEXT416((uint)fVar19),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[2][0]));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar15),
                            ZEXT416((uint)interpRenderFromPrimitive.mInv.m[2][2]));
  fVar19 = auVar8._0_4_;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar11,auVar11);
  auVar4 = vfmadd231ss_fma(auVar4,auVar16,auVar16);
  if (0.0 < auVar4._0_4_) {
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar3 = vandps_avx(auVar11,auVar18);
    auVar17 = vandps_avx(auVar8,auVar18);
    auVar18 = vandps_avx(auVar16,auVar18);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ *
                                           ((float)si.optionalValue._12_4_ -
                                           (float)si.optionalValue._8_4_) * 0.5)),
                             ZEXT416((uint)(((float)si.optionalValue._4_4_ -
                                            (float)si.optionalValue._0_4_) * 0.5)),auVar3);
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)(((float)si.optionalValue._20_4_ -
                                                   (float)si.optionalValue._16_4_) * 0.5)),auVar18);
    fVar15 = auVar3._0_4_ / auVar4._0_4_;
    fVar1 = auVar11._0_4_ * fVar15;
    local_328 = ZEXT416((uint)(fVar19 * fVar15));
    local_318 = ZEXT416((uint)(auVar16._0_4_ * fVar15));
    IVar9.high = fVar1;
    IVar9.low = fVar1;
    local_308 = auVar8;
    local_2f8 = auVar11;
    local_2e8 = auVar16;
    auVar12._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&si,IVar9);
    auVar12._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar12._0_16_);
    si.optionalValue._0_4_ = (undefined4)uVar2;
    si.optionalValue._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    IVar10.high = (float)local_328._0_4_;
    IVar10.low = (float)local_328._0_4_;
    auVar13._0_8_ =
         Interval<float>::operator+<float>((Interval<float> *)((long)&si.optionalValue + 8),IVar10);
    auVar13._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar13._0_16_);
    si.optionalValue._8_4_ = (undefined4)uVar2;
    si.optionalValue._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    i.high = (float)local_318._0_4_;
    i.low = (float)local_318._0_4_;
    auVar14._0_8_ =
         Interval<float>::operator+<float>((Interval<float> *)((long)&si.optionalValue + 0x10),i);
    auVar14._8_56_ = extraout_var_01;
    si.optionalValue._16_8_ = vmovlps_avx(auVar14._0_16_);
    tMax = tMax - fVar15;
    auVar11 = local_2f8;
    auVar8 = local_308;
    auVar16 = local_2e8;
  }
  auVar11 = vinsertps_avx(auVar11,auVar8,0x10);
  auVar3._4_4_ = si.optionalValue._4_4_;
  auVar3._0_4_ = si.optionalValue._0_4_;
  auVar3._8_4_ = si.optionalValue._8_4_;
  auVar3._12_4_ = si.optionalValue._12_4_;
  local_d8.o.super_Tuple3<pbrt::Point3,_float>.z =
       ((float)si.optionalValue._16_4_ + (float)si.optionalValue._20_4_) * 0.5;
  local_d8.time = r->time;
  local_d8.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar8 = vinsertps_avx(auVar3,ZEXT416((uint)si.optionalValue._12_4_),0x10);
  auVar17._0_4_ = (float)si.optionalValue._4_4_ + auVar8._0_4_;
  auVar17._4_4_ = (float)si.optionalValue._8_4_ + auVar8._4_4_;
  auVar17._8_4_ = auVar8._8_4_ + 0.0;
  auVar17._12_4_ = auVar8._12_4_ + 0.0;
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  auVar8 = vmulps_avx512vl(auVar17,auVar4);
  local_d8.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar8);
  local_d8.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar11);
  local_d8.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar16._0_4_;
  PrimitiveHandle::Intersect(&si,&this->primitive,&local_d8,tMax);
  if (si.set == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    Transform::operator()
              ((SurfaceInteraction *)&va,&interpRenderFromPrimitive,(SurfaceInteraction *)&si);
    if (si.set == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
    }
    si.optionalValue._64_8_ = local_190;
    IVar9 = _va;
    IVar10 = IStack_1c8;
    si.optionalValue._0_4_ = va;
    si.optionalValue._4_4_ = va._4_4_;
    si.optionalValue._8_4_ = va._8_4_;
    si.optionalValue._12_4_ = va._12_4_;
    si.optionalValue._16_4_ = IStack_1c0.low;
    si.optionalValue._20_4_ = IStack_1c0.high;
    si.optionalValue._24_4_ = FStack_1b8;
    si.optionalValue._28_4_ = fStack_1b4;
    si.optionalValue._32_4_ = fStack_1b0;
    si.optionalValue._36_4_ = fStack_1ac;
    si.optionalValue._40_4_ = aTStack_1a8[0].x;
    si.optionalValue._44_4_ = aTStack_1a8[0].y;
    uVar2 = si.optionalValue._40_8_;
    si.optionalValue._48_4_ = aTStack_1a8[0].z;
    si.optionalValue._52_4_ = aTStack_1a8[1].x;
    uVar5 = si.optionalValue._48_8_;
    si.optionalValue._56_4_ = aTStack_1a8[1].y;
    si.optionalValue._60_4_ = aTStack_1a8[1].z;
    si.optionalValue._72_8_ = local_188.bits;
    si.optionalValue._80_4_ = local_180[0].x;
    si.optionalValue._84_4_ = local_180[0].y;
    si.optionalValue._88_4_ = local_180[0].z;
    si.optionalValue._92_4_ = local_180[1].x;
    si.optionalValue._96_4_ = local_180[1].y;
    si.optionalValue._100_4_ = local_180[1].z;
    si.optionalValue._104_4_ = aTStack_168[0].x;
    si.optionalValue._108_4_ = aTStack_168[0].y;
    si.optionalValue._112_4_ = aTStack_168[0].z;
    si.optionalValue._116_4_ = aTStack_168[1].x;
    si.optionalValue._120_4_ = aTStack_168[1].y;
    si.optionalValue._124_4_ = aTStack_168[1].z;
    si.optionalValue._128_4_ = aTStack_150[0].x;
    si.optionalValue._132_4_ = aTStack_150[0].y;
    uVar6 = si.optionalValue._128_8_;
    si.optionalValue._136_4_ = aTStack_150[0].z;
    si.optionalValue._140_4_ = aTStack_150[1].x;
    uVar7 = si.optionalValue._136_8_;
    si.optionalValue._144_4_ = aTStack_150[1].y;
    si.optionalValue._148_4_ = aTStack_150[1].z;
    si.optionalValue._152_4_ = aTStack_138[0].x;
    si.optionalValue._156_4_ = aTStack_138[0].y;
    si.optionalValue._160_4_ = aTStack_138[0].z;
    si.optionalValue._164_4_ = aTStack_138[1].x;
    si.optionalValue._168_4_ = aTStack_138[1].y;
    si.optionalValue._172_4_ = aTStack_138[1].z;
    si.optionalValue._176_4_ = TStack_120.x;
    si.optionalValue._180_4_ = TStack_120.y;
    si.optionalValue._184_4_ = TStack_120.z;
    si.optionalValue._188_4_ = iStack_114;
    si.optionalValue._192_8_ = local_110.bits;
    si.optionalValue._200_8_ = local_108.bits;
    si.optionalValue._208_4_ = local_100[0].x;
    si.optionalValue._212_4_ = local_100[0].y;
    si.optionalValue._216_4_ = local_100[0].z;
    si.optionalValue._220_4_ = local_100[1].x;
    si.optionalValue._224_4_ = local_100[1].y;
    si.optionalValue._228_4_ = local_100[1].z;
    si.optionalValue._232_4_ = local_100[2].x;
    si.optionalValue._236_4_ = local_100[2].y;
    si.optionalValue._240_4_ = local_100[2].z;
    si.optionalValue._244_4_ = FStack_dc;
    si.optionalValue._40_4_ = (undefined4)aTStack_1a8[0]._0_8_;
    si.optionalValue._44_4_ = SUB84(aTStack_1a8[0]._0_8_,4);
    si.optionalValue._48_4_ = (undefined4)aTStack_1a8._8_8_;
    si.optionalValue._136_4_ = (undefined4)aTStack_150._8_8_;
    si.optionalValue._132_4_ = SUB84(aTStack_150[0]._0_8_,4);
    auVar11 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._44_4_),
                              ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                            (float)si.optionalValue._136_4_)),
                              ZEXT416((uint)si.optionalValue._132_4_));
    auVar8 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._136_4_),
                             ZEXT416((uint)si.optionalValue._48_4_),
                             ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                           (float)si.optionalValue._136_4_)));
    si.optionalValue._128_4_ = (undefined4)aTStack_150[0]._0_8_;
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + auVar8._0_4_)),
                              ZEXT416((uint)si.optionalValue._40_4_),
                              ZEXT416((uint)si.optionalValue._128_4_));
    va = auVar11._0_4_;
    vb = 0;
    if (auVar11._0_4_ < 0.0) {
      si.optionalValue._40_8_ = uVar2;
      si.optionalValue._48_8_ = uVar5;
      si.optionalValue._128_8_ = uVar6;
      si.optionalValue._136_8_ = uVar7;
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/primitive.cpp"
                 ,0xa0,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(char (*) [2])0x28e1834,
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(float *)&va,
                 (char (*) [2])0x28e1834,&vb);
    }
    __return_storage_ptr__->set = si.set;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)IVar9;
    *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 8) = IVar10;
    *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x10) = IStack_1c0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = _FStack_1b8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = _fStack_1b0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = aTStack_1a8[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = aTStack_1a8._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = aTStack_1a8[1]._4_8_;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_190;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_188.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_180[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_180._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_180[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = aTStack_168[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = aTStack_168._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = aTStack_168[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_150[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_150._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_150[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_150._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = aTStack_150[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = aTStack_138[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = aTStack_138._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = aTStack_138[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = TStack_120._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = stack0xfffffffffffffee8;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_110.bits;
    *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 200) = local_108.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_100[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_100._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = local_100[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_100[2]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = stack0xffffffffffffff20;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = si.optionalValue._248_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> AnimatedPrimitive::Intersect(const Ray &r,
                                                               Float tMax) const {
    // Compute _ray_ after transformation by _renderFromPrimitive_
    Transform interpRenderFromPrimitive = renderFromPrimitive.Interpolate(r.time);
    Ray ray = interpRenderFromPrimitive.ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};

    // Transform instance's intersection data to render space
    si->intr = interpRenderFromPrimitive(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}